

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  TelephoneMediator *this;
  Telephone *this_00;
  Telephone *this_01;
  
  this = (TelephoneMediator *)operator_new(0x20);
  TelephoneMediator::TelephoneMediator(this);
  this_00 = (Telephone *)operator_new(0x18);
  Telephone::Telephone(this_00,0x6f,this);
  this_01 = (Telephone *)operator_new(0x18);
  Telephone::Telephone(this_01,0xde,this);
  (*this_00->_vptr_Telephone[2])(this_00,0xde);
  (*this_01->_vptr_Telephone[2])(this_01,0x6f);
  (*this_00->_vptr_Telephone[1])(this_00);
  (*this_01->_vptr_Telephone[1])(this_01);
  (*this->_vptr_TelephoneMediator[1])(this);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TelephoneMediator* mediator = new TelephoneMediator();

	Telephone* p1 = new Telephone(111, mediator);
	Telephone* p2 = new Telephone(222, mediator);

	p1->dial(222);
	p2->dial(111);

	delete p1;
	delete p2;
	delete mediator;

	return 0;
}